

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O3

uint8_t on_shutdown(intptr_t fd,fio_protocol_s *ws)

{
  fio_write_args_s *pfVar1;
  uintptr_t uVar2;
  fio_write_args_s local_60;
  fio_write_args_s local_38;
  
  if ((ws != (fio_protocol_s *)0x0) &&
     (ws[1].on_shutdown != (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0)) {
    (*ws[1].on_shutdown)((intptr_t)ws,ws);
  }
  if (*(char *)((long)&ws[3].ping + 1) == '\0') {
    pfVar1 = &local_60;
    local_60.data.buffer = anon_var_dwarf_6892a;
    uVar2 = 2;
  }
  else {
    pfVar1 = &local_38;
    local_38.data.buffer = anon_var_dwarf_68920;
    uVar2 = 6;
  }
  (pfVar1->after).dealloc = FIO_DEALLOC_NOOP;
  pfVar1->length = uVar2;
  pfVar1->offset = 0;
  pfVar1->field_0x20 = 0;
  fio_write2_fn(fd,*pfVar1);
  return '\0';
}

Assistant:

static uint8_t on_shutdown(intptr_t fd, fio_protocol_s *ws) {
  (void)(fd);
  if (ws && ((ws_s *)ws)->on_shutdown)
    ((ws_s *)ws)->on_shutdown((ws_s *)ws);
  if (((ws_s *)ws)->is_client) {
    fio_write2(fd, .data.buffer = "\x8a\x80MASK", .length = 6,
               .after.dealloc = FIO_DEALLOC_NOOP);
  } else {
    fio_write2(fd, .data.buffer = "\x8a\x00", .length = 2,
               .after.dealloc = FIO_DEALLOC_NOOP);
  }
  return 0;
}